

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzer.cpp
# Opt level: O0

void __thiscall OneWireAnalyzer::SetupResults(OneWireAnalyzer *this)

{
  OneWireAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  OneWireAnalyzer *this_local;
  
  this_00 = (OneWireAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<OneWireAnalyzerSettings>::get(&this->mSettings);
  OneWireAnalyzerResults::OneWireAnalyzerResults(this_00,this,settings);
  std::auto_ptr<OneWireAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<OneWireAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<OneWireAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<OneWireAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void OneWireAnalyzer::SetupResults()
{
    mResults.reset( new OneWireAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mOneWireChannel );
}